

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironment.h
# Opt level: O1

void __thiscall
llbuild::basic::POSIXEnvironment::setIfMissing(POSIXEnvironment *this,StringRef key,StringRef value)

{
  pair<std::__detail::_Node_iterator<llvm::StringRef,_true,_true>,_bool> pVar1;
  __node_gen_type __node_gen;
  char *local_160;
  size_t local_158;
  StringRef local_150;
  SmallVectorImpl<char> local_140;
  char local_130 [256];
  
  local_158 = key.Length;
  local_160 = key.Data;
  if (this->isFrozen != true) {
    local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = &this->keys;
    pVar1 = std::
            _Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<llvm::StringRef_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,true>>>>
                      ((_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_140.super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                       &local_160);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x100;
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_130;
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                (&local_140,local_160,local_160 + local_158);
      local_150.Data._0_1_ = 0x3d;
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&local_140.super_SmallVectorTemplateBase<char,_true>,(char *)&local_150);
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                (&local_140,value.Data,value.Data + value.Length);
      local_150.Data = (char *)((ulong)local_150.Data._1_7_ << 8);
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                (&local_140.super_SmallVectorTemplateBase<char,_true>,(char *)&local_150);
      local_150.Length =
           local_140.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff;
      local_150.Data =
           (char *)local_140.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<llvm::StringRef>(&this->envStorage,&local_150);
      if ((char *)local_140.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_130) {
        free(local_140.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
      }
    }
    return;
  }
  __assert_fail("!isFrozen",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/POSIXEnvironment.h"
                ,0x43,"void llbuild::basic::POSIXEnvironment::setIfMissing(StringRef, StringRef)");
}

Assistant:

void setIfMissing(StringRef key, StringRef value) {
    assert(!isFrozen);
    if (keys.insert(key).second) {
      llvm::SmallString<256> assignment;
      assignment += key;
      assignment += '=';
      assignment += value;
      assignment += '\0';
      envStorage.emplace_back(assignment.str());
    }
  }